

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::web_peer_connection::on_receive
          (web_peer_connection *this,error_code *error,size_t bytes_transferred)

{
  web_seed_t *pwVar1;
  long lVar2;
  type tVar3;
  bool bVar4;
  int iVar5;
  index_type iVar8;
  ulong uVar9;
  char *pcVar10;
  undefined8 uVar11;
  uint uVar6;
  uint uVar7;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  undefined8 uVar12;
  torrent_info *this_01;
  int *piVar13;
  receive_buffer *this_02;
  char *pcVar14;
  element_type *peVar15;
  span<const_char> sVar16;
  span<const_char> sVar17;
  byte local_34a;
  span<const_char> local_258;
  span<const_char> local_248;
  int local_238;
  int local_234;
  int local_230;
  undefined1 local_229;
  int copy_size_1;
  span<const_char> local_218;
  span<const_char> local_208;
  undefined1 local_1f1;
  undefined1 auStack_1f0 [7];
  bool ret;
  span<const_char> chunk_start;
  int64_t chunk_size;
  undefined1 auStack_1d0 [4];
  int header_size;
  difference_type local_1c8;
  undefined1 local_1b9;
  error_code local_1b8;
  int local_1a4;
  int local_1a0;
  undefined1 local_199;
  int copy_size;
  reference local_188;
  file_request_t *file_req;
  type *range_end;
  type *range_start;
  undefined1 local_160 [8];
  error_code ec;
  string local_140;
  int local_11c;
  reference local_118;
  file_request_t *file_req_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i;
  const_iterator __end5;
  const_iterator __begin5;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range5;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *headers;
  error_code local_e0;
  tuple<int&,int&> local_d0 [16];
  difference_type local_c0;
  bool *local_b8;
  undefined1 local_b0 [18];
  bool failed;
  bool header_finished;
  int protocol;
  int payload;
  undefined1 auStack_78 [8];
  span<const_char> recv_buffer;
  undefined1 local_58 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  size_t bytes_transferred_local;
  error_code *error_local;
  web_peer_connection *this_local;
  
  bVar4 = boost::system::error_code::operator_cast_to_bool(error);
  if (bVar4) {
    peer_connection::received_bytes((peer_connection *)this,0,(int)bytes_transferred);
    bVar4 = peer_connection::should_log((peer_connection *)this,info);
    if (bVar4) {
      boost::system::error_code::message_abi_cxx11_
                ((string *)
                 &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,error);
      uVar11 = ::std::__cxx11::string::c_str();
      peer_connection::peer_log
                ((peer_connection *)this,info,"ERROR","web_peer_connection error: %s",uVar11);
      ::std::__cxx11::string::~string
                ((string *)
                 &t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  else {
    peer_connection::associated_torrent((peer_connection *)&recv_buffer.m_len);
    ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_58);
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
              ((weak_ptr<libtorrent::aux::torrent> *)&recv_buffer.m_len);
    sVar16 = receive_buffer::get(&(this->super_web_connection_base).super_peer_connection.
                                  m_recv_buffer);
    recv_buffer.m_ptr = (char *)sVar16.m_len;
    auStack_78 = (undefined1  [8])sVar16.m_ptr;
    handle_padfile(this);
    peer_connection::associated_torrent((peer_connection *)&payload);
    bVar4 = ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::expired
                      ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&payload)
    ;
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
              ((weak_ptr<libtorrent::aux::torrent> *)&payload);
    if (bVar4) {
      protocol = 1;
    }
    else {
      do {
        local_b0[0xb] = http_parser::header_finished(&(this->super_web_connection_base).m_parser);
        if (!(bool)local_b0[0xb]) {
          local_b0[10] = 0;
          span<char_const>::span<libtorrent::span<char_const>,char_const,void>
                    ((span<char_const> *)&local_c0,(span<const_char> *)auStack_78);
          sVar16.m_len = local_c0;
          sVar16.m_ptr = (char *)&(this->super_web_connection_base).m_parser;
          http_parser::incoming((http_parser *)local_b0,sVar16,local_b8);
          ::std::tie<int,int>((int *)local_d0,(int *)(local_b0 + 0x10));
          ::std::tuple<int&,int&>::operator=(local_d0,(tuple<int,_int> *)local_b0);
          peer_connection::received_bytes((peer_connection *)this,0,local_b0._12_4_);
          if ((local_b0[10] & 1) != 0) {
            iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
            peer_connection::received_bytes((peer_connection *)this,0,(int)iVar8);
            bVar4 = peer_connection::should_log((peer_connection *)this,info);
            if (bVar4) {
              uVar9 = span<const_char>::size((span<const_char> *)auStack_78);
              pcVar10 = span<const_char>::data((span<const_char> *)auStack_78);
              peer_connection::peer_log
                        ((peer_connection *)this,info,"RECEIVE_BYTES","%*s",uVar9 & 0xffffffff,
                         pcVar10);
            }
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      (&local_e0,http_parse_error,(type *)0x0);
            (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
              _vptr_bandwidth_socket[0x14])(this,&local_e0,1,2);
            protocol = 1;
            goto LAB_007ab4dc;
          }
          iVar5 = http_parser::status_code(&(this->super_web_connection_base).m_parser);
          if (iVar5 == -1) break;
          bVar4 = http_parser::header_finished(&(this->super_web_connection_base).m_parser);
          if (!bVar4) break;
          iVar5 = http_parser::body_start(&(this->super_web_connection_base).m_parser);
          (this->super_web_connection_base).m_body_start = iVar5;
          this->m_received_body = 0;
        }
        if ((local_b0[0xb] & 1) == 0) {
          this->m_num_responses = this->m_num_responses + 1;
          bVar4 = http_parser::connection_close(&(this->super_web_connection_base).m_parser);
          if (bVar4) {
            peer_connection::incoming_choke((peer_connection *)this);
            if (this->m_num_responses == 1) {
              this->m_web->supports_keepalive = false;
            }
          }
          bVar4 = peer_connection::should_log((peer_connection *)this,info);
          if (bVar4) {
            uVar6 = http_parser::status_code(&(this->super_web_connection_base).m_parser);
            http_parser::message_abi_cxx11_(&(this->super_web_connection_base).m_parser);
            uVar11 = ::std::__cxx11::string::c_str();
            peer_connection::peer_log
                      ((peer_connection *)this,info,"STATUS","%d %s",(ulong)uVar6,uVar11);
            this_00 = http_parser::headers_abi_cxx11_(&(this->super_web_connection_base).m_parser);
            __end5 = ::std::
                     multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::begin(this_00);
            i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)::std::
                   multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(this_00);
            while( true ) {
              bVar4 = ::std::operator!=(&__end5,(_Self *)&i);
              if (!bVar4) break;
              file_req_1 = (file_request_t *)
                           ::std::
                           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator*(&__end5);
              uVar11 = ::std::__cxx11::string::c_str();
              uVar12 = ::std::__cxx11::string::c_str();
              peer_connection::peer_log
                        ((peer_connection *)this,info,"STATUS","   %s: %s",uVar11,uVar12);
              ::std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator++(&__end5);
            }
          }
          iVar5 = http_parser::status_code(&(this->super_web_connection_base).m_parser);
          bVar4 = is_ok_status(iVar5);
          if (!bVar4) {
            bVar4 = ::std::
                    deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                    ::empty(&this->m_file_requests);
            if (!bVar4) {
              local_118 = ::std::
                          deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                          ::front(&this->m_file_requests);
              pwVar1 = this->m_web;
              peVar15 = ::std::
                        __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_58);
              this_01 = torrent::torrent_file(peVar15);
              iVar5 = torrent_info::num_files(this_01);
              bitfield::resize(&(pwVar1->have_files).super_bitfield,iVar5,true);
              local_11c = (local_118->file_index).m_val;
              typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
              ::clear_bit(&this->m_web->have_files,
                          (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)local_11c);
              uVar6 = http_parser::status_code(&(this->super_web_connection_base).m_parser);
              uVar7 = strong_typedef::operator_cast_to_int((strong_typedef *)local_118);
              peer_connection::peer_log
                        ((peer_connection *)this,info,"MISSING_FILE","http-code: %d | file: %d",
                         (ulong)uVar6,(ulong)uVar7);
            }
            iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
            handle_error(this,(int)iVar8);
            protocol = 1;
            goto LAB_007ab4dc;
          }
          iVar5 = http_parser::status_code(&(this->super_web_connection_base).m_parser);
          bVar4 = is_redirect(iVar5);
          if (bVar4) {
            iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
            handle_redirect(this,(int)iVar8);
            protocol = 1;
            goto LAB_007ab4dc;
          }
          anon_unknown_50::get_peer_name
                    (&local_140,&(this->super_web_connection_base).m_parser,
                     &(this->super_web_connection_base).m_host);
          ::std::__cxx11::string::operator=
                    ((string *)&(this->super_web_connection_base).m_server_string,
                     (string *)&local_140);
          ::std::__cxx11::string::~string((string *)&local_140);
          sVar16 = span<const_char>::subspan
                             ((span<const_char> *)auStack_78,
                              (long)(this->super_web_connection_base).m_body_start);
          recv_buffer.m_ptr = (char *)sVar16.m_len;
          ec.cat_ = (error_category *)sVar16.m_ptr;
          auStack_78 = (undefined1  [8])ec.cat_;
          iVar5 = http_parser::body_start(&(this->super_web_connection_base).m_parser);
          (this->super_web_connection_base).m_body_start = iVar5;
          this->m_received_body = 0;
        }
        bVar4 = span<const_char>::empty((span<const_char> *)auStack_78);
        if (bVar4) break;
        boost::system::error_code::error_code((error_code *)local_160);
        anon_unknown_50::get_range
                  ((anon_unknown_50 *)&range_start,&(this->super_web_connection_base).m_parser,
                   (error_code *)local_160);
        range_end = ::std::get<0ul,long,long>((tuple<long,_long> *)&range_start);
        file_req = (file_request_t *)::std::get<1ul,long,long>((tuple<long,_long> *)&range_start);
        bVar4 = boost::system::error_code::operator_cast_to_bool((error_code *)local_160);
        if (bVar4) {
          iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
          peer_connection::received_bytes((peer_connection *)this,0,(int)iVar8);
          disable(this,(error_code *)local_160);
          protocol = 1;
          goto LAB_007ab4dc;
        }
        local_188 = ::std::
                    deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                    ::front(&this->m_file_requests);
        if ((*range_end != local_188->start) ||
           (lVar2._0_4_ = file_req->file_index, lVar2._4_4_ = file_req->length,
           lVar2 != local_188->start + (long)local_188->length)) {
          iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
          peer_connection::received_bytes((peer_connection *)this,0,(int)iVar8);
          bVar4 = peer_connection::should_log((peer_connection *)this,incoming);
          if (bVar4) {
            uVar6 = strong_typedef::operator_cast_to_int((strong_typedef *)local_188);
            tVar3 = *range_end;
            uVar11._0_4_ = file_req->file_index;
            uVar11._4_4_ = file_req->length;
            iVar5 = strong_typedef::operator_cast_to_int((strong_typedef *)local_188);
            peer_connection::peer_log
                      ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                       "in=(%d, %ld-%ld) expected=(%d, %ld-%ld) ]",(ulong)uVar6,tVar3,uVar11,iVar5,
                       local_188->start,local_188->start + (long)local_188->length + -1);
          }
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&copy_size,invalid_range,(type *)0x0);
          local_199 = 2;
          (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
            _vptr_bandwidth_socket[0x14])(this,(error_code *)&copy_size,1,2);
          protocol = 1;
          goto LAB_007ab4dc;
        }
        bVar4 = http_parser::chunked_encoding(&(this->super_web_connection_base).m_parser);
        if (bVar4) {
          while( true ) {
            local_34a = 0;
            if (-1 < this->m_chunk_pos) {
              bVar4 = span<const_char>::empty((span<const_char> *)auStack_78);
              local_34a = bVar4 ^ 0xff;
            }
            if ((local_34a & 1) == 0) goto LAB_007ab2b0;
            if (0 < this->m_chunk_pos) {
              iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
              local_1a4 = (int)iVar8;
              piVar13 = ::std::min<int>(&this->m_chunk_pos,&local_1a4);
              local_1a0 = *piVar13;
              if (local_188->length < this->m_received_body + local_1a0) {
                iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
                peer_connection::received_bytes((peer_connection *)this,0,(int)iVar8);
                peer_connection::peer_log
                          ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                           "received body: %d request size: %d",(ulong)(uint)this->m_received_body,
                           (ulong)(uint)local_188->length);
                boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                          (&local_1b8,invalid_range,(type *)0x0);
                local_1b9 = 2;
                (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
                  _vptr_bandwidth_socket[0x14])(this,&local_1b8,1,2);
                protocol = 1;
                goto LAB_007ab4dc;
              }
              pcVar10 = span<const_char>::data((span<const_char> *)auStack_78);
              incoming_payload(this,pcVar10,local_1a0);
              sVar16 = span<const_char>::subspan((span<const_char> *)auStack_78,(long)local_1a0);
              recv_buffer.m_ptr = (char *)sVar16.m_len;
              auStack_78 = (undefined1  [8])sVar16.m_ptr;
              this->m_chunk_pos = this->m_chunk_pos - local_1a0;
              _auStack_1d0 = sVar16;
              bVar4 = span<const_char>::empty((span<const_char> *)auStack_78);
              if (bVar4) goto LAB_007ab41d;
            }
            chunk_size._4_4_ = 0;
            chunk_start.m_len = 0;
            sVar16 = span<const_char>::subspan
                               ((span<const_char> *)auStack_78,(long)this->m_chunk_pos);
            chunk_start.m_ptr = (char *)sVar16.m_len;
            _auStack_1f0 = sVar16.m_ptr;
            span<char_const>::span<libtorrent::span<char_const>,char_const,void>
                      ((span<char_const> *)&local_208,(span<const_char> *)auStack_1f0);
            local_1f1 = http_parser::parse_chunk_header
                                  (&(this->super_web_connection_base).m_parser,local_208,
                                   &chunk_start.m_len,(int *)((long)&chunk_size + 4));
            if (!(bool)local_1f1) {
              iVar8 = span<const_char>::size((span<const_char> *)auStack_1f0);
              peer_connection::received_bytes
                        ((peer_connection *)this,0,(int)iVar8 - this->m_partial_chunk_header);
              iVar8 = span<const_char>::size((span<const_char> *)auStack_1f0);
              this->m_partial_chunk_header = (int)iVar8;
              goto LAB_007ab41d;
            }
            peer_connection::peer_log
                      ((peer_connection *)this,info,"CHUNKED_ENCODING",
                       "parsed chunk: %ld header_size: %d",chunk_start.m_len,(ulong)chunk_size._4_4_
                      );
            peer_connection::received_bytes
                      ((peer_connection *)this,0,chunk_size._4_4_ - this->m_partial_chunk_header);
            this->m_partial_chunk_header = 0;
            this->m_chunk_pos = this->m_chunk_pos + (int)chunk_start.m_len;
            sVar16 = span<const_char>::subspan
                               ((span<const_char> *)auStack_78,(long)(int)chunk_size._4_4_);
            recv_buffer.m_ptr = (char *)sVar16.m_len;
            auStack_78 = (undefined1  [8])sVar16.m_ptr;
            local_218 = sVar16;
            if (chunk_start.m_len == 0) break;
            bVar4 = span<const_char>::empty((span<const_char> *)auStack_78);
            if (bVar4) goto LAB_007ab41d;
          }
          this->m_chunk_pos = -1;
          if (this->m_received_body != local_188->length) {
            iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
            peer_connection::received_bytes((peer_connection *)this,0,(int)iVar8);
            peer_connection::peer_log
                      ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                       "received body: %d request size: %d",(ulong)(uint)this->m_received_body,
                       (ulong)(uint)local_188->length);
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      ((error_code *)&copy_size_1,invalid_range,(type *)0x0);
            local_229 = 2;
            (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
              _vptr_bandwidth_socket[0x14])(this,(error_code *)&copy_size_1,1,2);
            protocol = 1;
            goto LAB_007ab4dc;
          }
          ::std::
          deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
          ::pop_front(&this->m_file_requests);
          http_parser::reset(&(this->super_web_connection_base).m_parser);
          (this->super_web_connection_base).m_body_start = 0;
          this->m_received_body = 0;
          this->m_chunk_pos = 0;
          this->m_partial_chunk_header = 0;
          handle_padfile(this);
LAB_007ab2b0:
          sVar17.m_len = (difference_type)recv_buffer.m_ptr;
          sVar17.m_ptr = (char *)auStack_78;
        }
        else {
          local_234 = local_188->length - this->m_received_body;
          iVar8 = span<const_char>::size((span<const_char> *)auStack_78);
          local_238 = (int)iVar8;
          piVar13 = ::std::min<int>(&local_234,&local_238);
          local_230 = *piVar13;
          pcVar10 = span<const_char>::data((span<const_char> *)auStack_78);
          incoming_payload(this,pcVar10,local_230);
          sVar17 = span<const_char>::subspan((span<const_char> *)auStack_78,(long)local_230);
          recv_buffer.m_ptr = (char *)sVar17.m_len;
          auStack_78 = (undefined1  [8])sVar17.m_ptr;
          local_248 = sVar17;
          if (this->m_received_body == local_188->length) {
            ::std::
            deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
            ::pop_front(&this->m_file_requests);
            http_parser::reset(&(this->super_web_connection_base).m_parser);
            (this->super_web_connection_base).m_body_start = 0;
            this->m_received_body = 0;
            this->m_chunk_pos = 0;
            this->m_partial_chunk_header = 0;
            handle_padfile(this);
            sVar17.m_len = (difference_type)recv_buffer.m_ptr;
            sVar17.m_ptr = (char *)auStack_78;
          }
        }
        recv_buffer.m_ptr = (char *)sVar17.m_len;
        auStack_78 = (undefined1  [8])sVar17.m_ptr;
        bVar4 = span<const_char>::empty((span<const_char> *)auStack_78);
      } while (!bVar4);
LAB_007ab41d:
      this_02 = &(this->super_web_connection_base).super_peer_connection.m_recv_buffer;
      pcVar10 = span<const_char>::data((span<const_char> *)auStack_78);
      local_258 = receive_buffer::get(this_02);
      pcVar14 = span<const_char>::begin(&local_258);
      peVar15 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_58);
      iVar5 = torrent::block_size(peVar15);
      receive_buffer::cut(this_02,(int)pcVar10 - (int)pcVar14,iVar5 + 5000,0);
      protocol = 0;
    }
LAB_007ab4dc:
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_58);
  }
  return;
}

Assistant:

void web_peer_connection::on_receive(error_code const& error
	, std::size_t bytes_transferred)
{
	INVARIANT_CHECK;

	if (error)
	{
		received_bytes(0, int(bytes_transferred));
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "ERROR"
				, "web_peer_connection error: %s", error.message().c_str());
		}
#endif
		return;
	}

	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	// in case the first file on this series of requests is a padfile
	// we need to handle it right now
	span<char const> recv_buffer = m_recv_buffer.get();
	handle_padfile();
	if (associated_torrent().expired()) return;

	for (;;)
	{
		int payload;
		int protocol;
		bool header_finished = m_parser.header_finished();
		if (!header_finished)
		{
			bool failed = false;
			std::tie(payload, protocol) = m_parser.incoming(recv_buffer, failed);
			received_bytes(0, protocol);
			TORRENT_ASSERT(int(recv_buffer.size()) >= protocol);

			if (failed)
			{
				received_bytes(0, int(recv_buffer.size()));
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log(peer_log_alert::info))
				{
					peer_log(peer_log_alert::info, "RECEIVE_BYTES"
						, "%*s", int(recv_buffer.size()), recv_buffer.data());
				}
#endif
				disconnect(errors::http_parse_error, operation_t::bittorrent, peer_error);
				return;
			}

			TORRENT_ASSERT(recv_buffer.empty() || recv_buffer[0] == 'H');
			TORRENT_ASSERT(int(recv_buffer.size()) <= m_recv_buffer.packet_size());

			// this means the entire status line hasn't been received yet
			if (m_parser.status_code() == -1)
			{
				TORRENT_ASSERT(payload == 0);
				break;
			}

			if (!m_parser.header_finished())
			{
				TORRENT_ASSERT(payload == 0);
				break;
			}

			m_body_start = m_parser.body_start();
			m_received_body = 0;
		}

		// we just completed reading the header
		if (!header_finished)
		{
			++m_num_responses;

			if (m_parser.connection_close())
			{
				incoming_choke();
				if (m_num_responses == 1)
					m_web->supports_keepalive = false;
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "STATUS"
					, "%d %s", m_parser.status_code(), m_parser.message().c_str());
				auto const& headers = m_parser.headers();
				for (auto const &i : headers)
					peer_log(peer_log_alert::info, "STATUS", "   %s: %s", i.first.c_str(), i.second.c_str());
			}
#endif

			// if the status code is not one of the accepted ones, abort
			if (!aux::is_ok_status(m_parser.status_code()))
			{
				if (!m_file_requests.empty())
				{
					file_request_t const& file_req = m_file_requests.front();
					m_web->have_files.resize(t->torrent_file().num_files(), true);
					m_web->have_files.clear_bit(file_req.file_index);

#ifndef TORRENT_DISABLE_LOGGING
					peer_log(peer_log_alert::info, "MISSING_FILE", "http-code: %d | file: %d"
						, m_parser.status_code(), static_cast<int>(file_req.file_index));
#endif
				}
				handle_error(int(recv_buffer.size()));
				return;
			}

			if (aux::is_redirect(m_parser.status_code()))
			{
				handle_redirect(int(recv_buffer.size()));
				return;
			}

			m_server_string = get_peer_name(m_parser, m_host);

			recv_buffer = recv_buffer.subspan(m_body_start);

			m_body_start = m_parser.body_start();
			m_received_body = 0;
		}

		// we only received the header, no data
		if (recv_buffer.empty()) break;

		// ===================================
		// ======= RESPONSE BYTE RANGE =======
		// ===================================

		// despite the HTTP range being inclusive, range_start and range_end are
		// exclusive to fit better into C++. i.e. range_end points one byte past
		// the end of the payload
		error_code ec;
		auto const [range_start, range_end] = get_range(m_parser, ec);
		if (ec)
		{
			received_bytes(0, int(recv_buffer.size()));
			disable(ec);
			return;
		}

		TORRENT_ASSERT(!m_file_requests.empty());
		file_request_t const& file_req = m_file_requests.front();
		if (range_start != file_req.start
			|| range_end != file_req.start + file_req.length)
		{
			// the byte range in the http response is different what we expected
			received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::incoming))
			{
				peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
					, "in=(%d, %" PRId64 "-%" PRId64 ") expected=(%d, %" PRId64 "-%" PRId64 ") ]"
					, static_cast<int>(file_req.file_index), range_start, range_end
					, static_cast<int>(file_req.file_index), file_req.start, file_req.start + file_req.length - 1);
			}
#endif
			disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_parser.chunked_encoding())
		{

			// =========================
			// === CHUNKED ENCODING  ===
			// =========================

			while (m_chunk_pos >= 0 && !recv_buffer.empty())
			{
				// first deliver any payload we have in the buffer so far, ahead of
				// the next chunk header.
				if (m_chunk_pos > 0)
				{
					int const copy_size = std::min(m_chunk_pos, int(recv_buffer.size()));
					TORRENT_ASSERT(copy_size > 0);

					if (m_received_body + copy_size > file_req.length)
					{
						// the byte range in the http response is different what we expected
						received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
						peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
							, "received body: %d request size: %d"
							, m_received_body, file_req.length);
#endif
						disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
						return;
					}
					incoming_payload(recv_buffer.data(), copy_size);

					recv_buffer = recv_buffer.subspan(copy_size);
					m_chunk_pos -= copy_size;

					if (recv_buffer.empty()) goto done;
				}

				TORRENT_ASSERT(m_chunk_pos == 0);

				int header_size = 0;
				std::int64_t chunk_size = 0;
				span<char const> chunk_start = recv_buffer.subspan(m_chunk_pos);
				TORRENT_ASSERT(chunk_start[0] == '\r'
					|| aux::is_hex({chunk_start.data(), 1}));
				bool const ret = m_parser.parse_chunk_header(chunk_start, &chunk_size, &header_size);
				if (!ret)
				{
					received_bytes(0, int(chunk_start.size()) - m_partial_chunk_header);
					m_partial_chunk_header = int(chunk_start.size());
					goto done;
				}
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CHUNKED_ENCODING"
					, "parsed chunk: %" PRId64 " header_size: %d"
					, chunk_size, header_size);
#endif
				received_bytes(0, header_size - m_partial_chunk_header);
				m_partial_chunk_header = 0;
				TORRENT_ASSERT(chunk_size != 0
					|| int(chunk_start.size()) <= header_size || chunk_start[header_size] == 'H');
				TORRENT_ASSERT(m_body_start + m_chunk_pos < INT_MAX);
				m_chunk_pos += int(chunk_size);
				recv_buffer = recv_buffer.subspan(header_size);

				// a chunk size of zero means the request is complete. Make sure the
				// number of payload bytes we've received matches the number we
				// requested. If that's not the case, we got an invalid response.
				if (chunk_size == 0)
				{
					TORRENT_ASSERT_VAL(m_chunk_pos == 0, m_chunk_pos);

#if TORRENT_USE_ASSERTS
					span<char const> chunk = recv_buffer.subspan(m_chunk_pos);
					TORRENT_ASSERT(chunk.size() == 0 || chunk[0] == 'H');
#endif
					m_chunk_pos = -1;

					TORRENT_ASSERT(m_received_body <= file_req.length);
					if (m_received_body != file_req.length)
					{
						// the byte range in the http response is different what we expected
						received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
						peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
							, "received body: %d request size: %d"
							, m_received_body, file_req.length);
#endif
						disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
						return;
					}
					// we just completed an HTTP file request. pop it from m_file_requests
					m_file_requests.pop_front();
					m_parser.reset();
					m_body_start = 0;
					m_received_body = 0;
					m_chunk_pos = 0;
					m_partial_chunk_header = 0;

					// in between each file request, there may be an implicit
					// pad-file request
					handle_padfile();
					break;
				}

				// if all of the receive buffer was just consumed as chunk
				// header, we're done
				if (recv_buffer.empty()) goto done;
			}
		}
		else
		{
			// this is the simple case, where we don't have chunked encoding
			TORRENT_ASSERT(m_received_body <= file_req.length);
			int const copy_size = std::min(file_req.length - m_received_body
				, int(recv_buffer.size()));
			incoming_payload(recv_buffer.data(), copy_size);
			recv_buffer = recv_buffer.subspan(copy_size);

			TORRENT_ASSERT(m_received_body <= file_req.length);
			if (m_received_body == file_req.length)
			{
				// we just completed an HTTP file request. pop it from m_file_requests
				m_file_requests.pop_front();
				m_parser.reset();
				m_body_start = 0;
				m_received_body = 0;
				m_chunk_pos = 0;
				m_partial_chunk_header = 0;

				// in between each file request, there may be an implicit
				// pad-file request
				handle_padfile();
			}
		}

		if (recv_buffer.empty()) break;
	}
done:

	// now, remove all the bytes we've processed from the receive buffer
	m_recv_buffer.cut(int(recv_buffer.data() - m_recv_buffer.get().begin())
		, t->block_size() + request_size_overhead);
}